

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::ParseableFunctionInfo::CleanupToReparseHelper(ParseableFunctionInfo *this)

{
  undefined1 *puVar1;
  bool bVar2;
  
  if ((((this->super_FunctionProxy).field_0x46 & 4) != 0) &&
     ((BYTE *)this->m_dynamicInterpreterThunk != (BYTE *)0x0)) {
    ScriptContext::ReleaseDynamicAsmJsInterpreterThunk
              ((this->super_FunctionProxy).m_scriptContext,(BYTE *)this->m_dynamicInterpreterThunk,
               true);
    this->m_dynamicInterpreterThunk = (Type)0x0;
  }
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
            (&this->super_FunctionProxy,(ScopeInfo *)0x0);
  this->scopeSlotArraySize = 0;
  this->paramScopeSlotArraySize = 0;
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)13,int*>
            (&this->super_FunctionProxy,(int *)0x0);
  (((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_lineOffsetCache).ptr =
       (LineOffsetCache *)0x0;
  bVar2 = FunctionProxy::IsClassConstructor(&this->super_FunctionProxy);
  this->flags = !bVar2 << 6;
  this->m_inParamCount = 0;
  this->m_reportedInParamCount = 0;
  puVar1 = &(this->super_FunctionProxy).field_0x46;
  *puVar1 = *puVar1 & 0xf9;
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparseHelper()
    {
#if DYNAMIC_INTERPRETER_THUNK
        if (m_isAsmJsFunction && m_dynamicInterpreterThunk)
        {
            m_scriptContext->ReleaseDynamicAsmJsInterpreterThunk((BYTE*)this->m_dynamicInterpreterThunk, true);
            this->m_dynamicInterpreterThunk = nullptr;
        }
#endif

        this->SetScopeInfo(nullptr);
        this->SetPropertyIdsForScopeSlotArray(nullptr, 0);

        this->GetUtf8SourceInfo()->DeleteLineOffsetCache();

        // Reset to default.
        this->flags = this->IsClassConstructor() ? Flags_None : Flags_HasNoExplicitReturnValue;

        ResetInParams();

        this->m_isAsmjsMode = false;
        this->m_isAsmJsFunction = false;
    }